

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::ScrollbarEx(ImRect *bb_frame,ImGuiID id,ImGuiAxis axis,ImS64 *p_scroll_v,
                       ImS64 size_visible_v,ImS64 size_contents_v,ImDrawFlags flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  ImGuiContext *pIVar3;
  ImGuiWindow *pIVar4;
  long *plVar5;
  bool bVar6;
  ushort uVar7;
  ImU32 col;
  ImU32 col_00;
  long lVar8;
  long lVar9;
  ushort uVar10;
  ImGuiCol idx;
  long lVar11;
  uint uVar12;
  float fVar13;
  int iVar14;
  float fVar17;
  int iVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined4 in_XMM5_Db;
  float fVar29;
  bool local_de;
  bool local_dd;
  float local_dc;
  ImRect local_d8;
  ImGuiAxis local_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  ImGuiWindow *local_a0;
  float local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  long *local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  ImVec2 local_40;
  ImVec2 local_38;
  undefined1 auVar23 [16];
  
  pIVar3 = GImGui;
  local_a0 = GImGui->CurrentWindow;
  if (local_a0->SkipItems == false) {
    fVar13 = (bb_frame->Max).x - (bb_frame->Min).x;
    fVar17 = (bb_frame->Max).y - (bb_frame->Min).y;
    local_de = false;
    if ((0.0 < fVar13) && (0.0 < fVar17)) {
      local_dc = 1.0;
      if (axis == ImGuiAxis_Y) {
        fVar25 = (GImGui->Style).FramePadding.y;
        fVar25 = fVar25 + fVar25;
        if (fVar17 < fVar25 + GImGui->FontSize) {
          fVar25 = (fVar17 - GImGui->FontSize) / fVar25;
          if (fVar25 < 0.0) {
            return false;
          }
          local_dc = 1.0;
          if (fVar25 <= 1.0) {
            local_dc = fVar25;
          }
          if (local_dc <= 0.0) {
            return false;
          }
        }
      }
      iVar14 = (int)((fVar13 + -2.0) * 0.5);
      iVar18 = (int)((fVar17 + -2.0) * 0.5);
      auVar27._0_4_ = -(uint)(iVar14 < 0);
      auVar27._4_4_ = -(uint)(iVar18 < 0);
      auVar27._8_8_ = 0;
      auVar15._0_4_ = -(uint)(3 < iVar14);
      auVar15._4_4_ = -(uint)(3 < iVar18);
      auVar15._8_8_ = 0;
      auVar28._8_4_ = 0x80000000;
      auVar28._0_8_ = CONCAT44((float)iVar18,(float)iVar14) ^ 0x8000000080000000;
      auVar28._12_4_ = 0x80000000;
      auVar28 = auVar27 & _DAT_001e9590 | ~auVar27 & (auVar15 & _DAT_001f27a0 | ~auVar15 & auVar28);
      fStack_b0 = auVar28._0_4_;
      fVar17 = auVar28._4_4_;
      auVar21._0_8_ = auVar28._0_8_;
      auVar21._8_4_ = fStack_b0;
      auVar21._12_4_ = fVar17;
      local_d8.Min.x = (bb_frame->Min).x;
      local_d8.Min.y = (bb_frame->Min).y;
      local_d8.Max.x = (bb_frame->Max).x;
      local_d8.Max.y = (bb_frame->Max).y;
      local_b8 = local_d8.Min.x - fStack_b0;
      fVar13 = local_d8.Min.y - fVar17;
      fStack_b0 = local_d8.Max.x + fStack_b0;
      fStack_b4 = local_d8.Max.y + fVar17;
      auVar2._4_8_ = auVar21._8_8_;
      auVar2._0_4_ = local_d8.Min.y + fVar17;
      auVar22._0_8_ = auVar2._0_8_ << 0x20;
      auVar22._8_4_ = fStack_b0;
      auVar22._12_4_ = fStack_b4;
      local_d8.Max = auVar22._8_8_;
      local_d8.Min.y = fVar13;
      local_d8.Min.x = local_b8;
      if (axis != ImGuiAxis_X) {
        fStack_b0 = fStack_b4;
        local_b8 = fVar13;
      }
      local_b8 = fStack_b0 - local_b8;
      lVar11 = size_contents_v - size_visible_v;
      if (lVar11 == 0 || size_contents_v < size_visible_v) {
        size_contents_v = size_visible_v;
      }
      if (size_contents_v < 2) {
        size_contents_v = 1;
      }
      local_58 = ZEXT416((uint)(float)size_visible_v);
      fVar25 = ((float)size_visible_v / (float)size_contents_v) * local_b8;
      fVar13 = (GImGui->Style).GrabMinSize;
      fVar17 = local_b8;
      if (fVar25 <= local_b8) {
        fVar17 = fVar25;
      }
      uVar12 = -(uint)(fVar25 < fVar13);
      local_88 = (float)(uVar12 & (uint)fVar13 | ~uVar12 & (uint)fVar17);
      local_de = false;
      local_dd = false;
      local_bc = axis;
      fStack_ac = fStack_b4;
      fStack_84 = fStack_b4;
      fStack_80 = fStack_b0;
      fStack_7c = fStack_b4;
      local_70 = p_scroll_v;
      ItemAdd(bb_frame,id,(ImRect *)0x0,2);
      ButtonBehavior(&local_d8,id,&local_dd,&local_de,0x40000);
      plVar5 = local_70;
      auVar24._4_4_ = fStack_b4;
      auVar24._0_4_ = local_b8;
      if (lVar11 < 2) {
        lVar11 = 1;
      }
      fVar13 = (float)lVar11;
      auVar16._4_4_ = (float)*local_70;
      auVar16._0_4_ = local_88;
      auVar16._8_4_ = fStack_84;
      auVar16._12_4_ = 0;
      auVar24._8_4_ = fStack_b4;
      auVar24._12_4_ = in_XMM5_Db;
      auVar23._8_8_ = auVar24._8_8_;
      auVar23._4_4_ = fVar13;
      auVar23._0_4_ = local_b8;
      auVar28 = divps(auVar16,auVar23);
      fVar25 = auVar28._0_4_;
      fVar29 = auVar28._4_4_;
      auVar1._4_4_ = -(uint)(fVar25 < 1.0);
      auVar1._0_4_ = -(uint)(fVar25 < 1.0);
      auVar1._8_4_ = -(uint)(fVar29 < 0.0);
      auVar1._12_4_ = -(uint)(fVar29 < 0.0);
      uVar12 = movmskpd(1,auVar1);
      fVar17 = 0.0;
      if (((uVar12 & 2) == 0) && (fVar17 = 1.0, fVar29 <= 1.0)) {
        fVar17 = fVar29;
      }
      fVar29 = local_b8 - local_88;
      fVar17 = (fVar17 * fVar29) / local_b8;
      if (((1.0 <= local_dc) && ((uVar12 & 1) != 0)) && (local_de != false)) {
        fVar19 = (*(float *)((pIVar3->IO).MouseDown + (long)local_bc * 4 + -8) -
                 (&local_d8.Min.x)[local_bc]) / local_b8;
        fVar20 = 1.0;
        if (fVar19 <= 1.0) {
          fVar20 = fVar19;
        }
        fVar26 = 0.0;
        fVar20 = (float)(~-(uint)(fVar19 < 0.0) & (uint)fVar20);
        uVar10 = 0xffff;
        if (fVar17 <= fVar20) {
          uVar10 = (ushort)(fVar25 + fVar17 < fVar20);
        }
        if (pIVar3->ActiveIdIsJustActivated == false) {
          uVar7 = pIVar3->ScrollbarSeekMode;
        }
        else {
          pIVar3->ScrollbarSeekMode = uVar10;
          if (uVar10 == 0) {
            fVar26 = fVar25 * -0.5 + (fVar20 - fVar17);
          }
          pIVar3->ScrollbarClickDeltaToGrabCenter = fVar26;
          uVar7 = uVar10;
        }
        if (uVar7 == 0) {
          fVar25 = (fVar25 * -0.5 + (fVar20 - pIVar3->ScrollbarClickDeltaToGrabCenter)) /
                   (1.0 - fVar25);
          fVar17 = 1.0;
          if (fVar25 <= 1.0) {
            fVar17 = fVar25;
          }
          lVar8 = (long)((float)(~-(uint)(fVar25 < 0.0) & (uint)fVar17) * fVar13);
          *local_70 = lVar8;
        }
        else {
          fStack_5c = fStack_ac;
          local_98 = fVar13;
          local_68 = fVar29;
          fStack_64 = fStack_b4;
          fStack_60 = fStack_b0;
          bVar6 = IsMouseClicked(0,1,0);
          fVar13 = local_98;
          fVar29 = local_68;
          if (bVar6) {
            lVar8 = *plVar5;
            if (uVar10 == pIVar3->ScrollbarSeekMode) {
              fVar17 = (float)local_58._0_4_;
              if (pIVar3->ScrollbarSeekMode < 1) {
                fVar17 = -(float)local_58._0_4_;
              }
              lVar9 = lVar8 + (long)fVar17;
              if (lVar9 < lVar11) {
                lVar11 = lVar9;
              }
              lVar8 = 0;
              if (-1 < lVar9) {
                lVar8 = lVar11;
              }
              *plVar5 = lVar8;
            }
          }
          else {
            lVar8 = *plVar5;
          }
        }
        fVar13 = (float)lVar8 / fVar13;
        fVar17 = 1.0;
        if (fVar13 <= 1.0) {
          fVar17 = fVar13;
        }
        fVar17 = (fVar29 * (float)(~-(uint)(fVar13 < 0.0) & (uint)fVar17)) / local_b8;
      }
      local_b8 = fVar17;
      pIVar4 = local_a0;
      col = GetColorU32(0xe,1.0);
      idx = 0x11;
      if (local_de == false) {
        idx = (local_dd & 1) + 0xf;
      }
      col_00 = GetColorU32(idx,local_dc);
      ImDrawList::AddRectFilled
                (pIVar4->DrawList,&bb_frame->Min,&bb_frame->Max,col,pIVar4->WindowRounding,flags);
      if (local_bc == ImGuiAxis_X) {
        local_40.x = local_d8.Min.x + (local_d8.Max.x - local_d8.Min.x) * local_b8;
        local_38.x = local_88 + local_40.x;
        local_38.y = local_d8.Max.y;
        local_40.y = local_d8.Min.y;
      }
      else {
        local_40.y = (local_d8.Max.y - local_d8.Min.y) * local_b8 + local_d8.Min.y;
        local_38.y = local_88 + local_40.y;
        local_38.x = local_d8.Max.x;
        local_40.x = local_d8.Min.x;
      }
      ImDrawList::AddRectFilled
                (pIVar4->DrawList,&local_40,&local_38,col_00,(pIVar3->Style).ScrollbarRounding,0);
    }
  }
  else {
    local_de = false;
  }
  return local_de;
}

Assistant:

bool ImGui::ScrollbarEx(const ImRect& bb_frame, ImGuiID id, ImGuiAxis axis, ImS64* p_scroll_v, ImS64 size_visible_v, ImS64 size_contents_v, ImDrawFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const float bb_frame_width = bb_frame.GetWidth();
    const float bb_frame_height = bb_frame.GetHeight();
    if (bb_frame_width <= 0.0f || bb_frame_height <= 0.0f)
        return false;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the window resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_frame_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
        alpha = ImSaturate((bb_frame_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
    if (alpha <= 0.0f)
        return false;

    const ImGuiStyle& style = g.Style;
    const bool allow_interaction = (alpha >= 1.0f);

    ImRect bb = bb_frame;
    bb.Expand(ImVec2(-ImClamp(IM_TRUNC((bb_frame_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp(IM_TRUNC((bb_frame_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    const float scrollbar_size_v = (axis == ImGuiAxis_X) ? bb.GetWidth() : bb.GetHeight();

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(size_contents_v, size_visible_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const ImS64 win_size_v = ImMax(ImMax(size_contents_v, size_visible_v), (ImS64)1);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * ((float)size_visible_v / (float)win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    ItemAdd(bb_frame, id, NULL, ImGuiItemFlags_NoNav);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    const ImS64 scroll_max = ImMax((ImS64)1, size_contents_v - size_visible_v);
    float scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v; // Grab position in normalized space
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        const float scrollbar_pos_v = bb.Min[axis];
        const float mouse_pos_v = g.IO.MousePos[axis];

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);

        const int held_dir = (clicked_v_norm < grab_v_norm) ? -1 : (clicked_v_norm > grab_v_norm + grab_h_norm) ? +1 : 0;
        if (g.ActiveIdIsJustActivated)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            g.ScrollbarSeekMode = (short)held_dir;
            g.ScrollbarClickDeltaToGrabCenter = (g.ScrollbarSeekMode == 0.0f) ? clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f : 0.0f;
        }

        // Apply scroll (p_scroll_v will generally point on one member of window->Scroll)
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of ContentSize and before setting up our starting position
        if (g.ScrollbarSeekMode == 0)
        {
            // Absolute seeking
            const float scroll_v_norm = ImSaturate((clicked_v_norm - g.ScrollbarClickDeltaToGrabCenter - grab_h_norm * 0.5f) / (1.0f - grab_h_norm));
            *p_scroll_v = (ImS64)(scroll_v_norm * scroll_max);
        }
        else
        {
            // Page by page
            if (IsMouseClicked(ImGuiMouseButton_Left, ImGuiInputFlags_Repeat) && held_dir == g.ScrollbarSeekMode)
            {
                float page_dir = (g.ScrollbarSeekMode > 0.0f) ? +1.0f : -1.0f;
                *p_scroll_v = ImClamp(*p_scroll_v + (ImS64)(page_dir * size_visible_v), (ImS64)0, scroll_max);
            }
        }

        // Update values for rendering
        scroll_ratio = ImSaturate((float)*p_scroll_v / (float)scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seek'ed and saturated
        //if (seek_absolute)
        //    g.ScrollbarClickDeltaToGrabCenter = clicked_v_norm - grab_v_norm - grab_h_norm * 0.5f;
    }

    // Render
    const ImU32 bg_col = GetColorU32(ImGuiCol_ScrollbarBg);
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    window->DrawList->AddRectFilled(bb_frame.Min, bb_frame.Max, bg_col, window->WindowRounding, flags);
    ImRect grab_rect;
    if (axis == ImGuiAxis_X)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels);
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);

    return held;
}